

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minihttp.cpp
# Opt level: O2

void __thiscall minihttp::HttpSocket::HttpSocket(HttpSocket *this)

{
  _Rb_tree_header *p_Var1;
  
  TcpSocket::TcpSocket(&this->super_TcpSocket);
  (this->super_TcpSocket)._vptr_TcpSocket = (_func_int **)&PTR__HttpSocket_0010eca0;
  (this->_user_agent)._M_dataplus._M_p = (pointer)&(this->_user_agent).field_2;
  (this->_user_agent)._M_string_length = 0;
  (this->_user_agent).field_2._M_local_buf[0] = '\0';
  (this->_accept_encoding)._M_dataplus._M_p = (pointer)&(this->_accept_encoding).field_2;
  (this->_accept_encoding)._M_string_length = 0;
  (this->_accept_encoding).field_2._M_local_buf[0] = '\0';
  (this->_tmpHdr)._M_dataplus._M_p = (pointer)&(this->_tmpHdr).field_2;
  (this->_tmpHdr)._M_string_length = 0;
  (this->_tmpHdr).field_2._M_local_buf[0] = '\0';
  this->_keep_alive = 0;
  this->_remaining = 0;
  this->_status = 0;
  std::queue<minihttp::Request,std::deque<minihttp::Request,std::allocator<minihttp::Request>>>::
  queue<std::deque<minihttp::Request,std::allocator<minihttp::Request>>,void>(&this->_requestQ);
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->_hdrs)._M_t._M_impl.super__Rb_tree_header;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->_hdrs)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  Request::Request(&this->_curRequest);
  this->_inProgress = false;
  this->_chunkedTransfer = false;
  this->_mustClose = true;
  this->_followRedir = true;
  this->_alwaysHandle = false;
  return;
}

Assistant:

HttpSocket::HttpSocket()
	: TcpSocket()
	, _keep_alive(0)
	, _remaining(0)
	, _status(0)
	, _inProgress(false)
	, _chunkedTransfer(false)
	, _mustClose(true)
	, _followRedir(true)
	, _alwaysHandle(false)
{
}